

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cpp
# Opt level: O0

bool slang::svGlobMatchesInternal(string_view path,string_view pattern)

{
  string_view pattern_00;
  string_view str;
  string_view pattern_01;
  string_view path_00;
  bool bVar1;
  char *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  size_t in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff56;
  byte bVar3;
  undefined1 in_stack_ffffffffffffff58 [16];
  string_view in_stack_ffffffffffffff68;
  string_view *this;
  string_view in_stack_ffffffffffffff78;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  basic_string_view<char,_std::char_traits<char>_> in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  char *pcVar4;
  size_t in_stack_ffffffffffffffc0;
  char *pcVar5;
  char *pcVar6;
  
  do {
    this_00 = (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff78._M_str;
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd8)
    ;
    bVar3 = 0;
    if (!bVar1) {
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &stack0xffffffffffffffe8);
      bVar3 = bVar1 ^ 0xff;
    }
    if ((bVar3 & 1) == 0) {
      nextSegment((string_view *)in_stack_ffffffffffffff68._M_str);
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &stack0xffffffffffffffd8);
      if (!bVar1) {
        return false;
      }
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &stack0xffffffffffffffe8);
      return bVar1;
    }
    bVar2 = sv((char *)CONCAT17(bVar3,CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50))
               ,in_stack_ffffffffffffff48);
    pcVar4 = (char *)bVar2._M_len;
    pcVar6 = bVar2._M_str;
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                      (this_00,in_stack_ffffffffffffff88);
    this = (string_view *)in_stack_ffffffffffffff68._M_str;
    if (bVar1) {
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (this,in_stack_ffffffffffffff68._M_len,in_stack_ffffffffffffff58._8_8_);
      pcVar4 = (char *)bVar2._M_len;
      pcVar5 = bVar2._M_str;
      do {
        path_00._M_str = in_RDI;
        path_00._M_len = (size_t)pcVar5;
        pattern_01._M_str = pcVar4;
        pattern_01._M_len = (size_t)pcVar6;
        bVar1 = svGlobMatchesInternal(path_00,pattern_01);
        if (bVar1) {
          return true;
        }
        nextSegment((string_view *)in_stack_ffffffffffffff68._M_str);
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           &stack0xffffffffffffffe8);
      } while (((bVar1 ^ 0xffU) & 1) != 0);
      return false;
    }
    in_stack_ffffffffffffff78 = nextSegment(this);
    in_stack_ffffffffffffff68 = nextSegment(this);
    str._M_str = pcVar4;
    str._M_len = in_stack_ffffffffffffffc0;
    pattern_00._M_str = in_stack_ffffffffffffffb8;
    pattern_00._M_len = in_stack_ffffffffffffffb0;
    bVar1 = matches(str,pattern_00);
  } while (bVar1);
  return false;
}

Assistant:

static bool svGlobMatchesInternal(std::string_view path, std::string_view pattern) {
    while (!pattern.empty() && !path.empty()) {
        // Special case for recursive directory search.
        if (pattern.starts_with("..."sv)) {
            pattern = pattern.substr(3);
            do {
                if (svGlobMatchesInternal(path, pattern))
                    return true;

                nextSegment(path);
            } while (!path.empty());

            return false;
        }

        // If the next segments don't match then we don't match overall.
        if (!matches(nextSegment(path), nextSegment(pattern))) {
            return false;
        }
    }

    // We match if:
    // 1) we used up the whole pattern
    // 2) pattern ended in a separator and the next path segment is the last (i.e. the file name)
    //    -- OR --
    //    pattern didn't end in a separator and we matched the whole path (so it's empty now)
    nextSegment(path);
    return pattern.empty() && path.empty();
}